

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

tuple<graph,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
* read_model<std::ifstream>
            (tuple<graph,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
             *__return_storage_ptr__,basic_ifstream<char,_std::char_traits<char>_> *stream)

{
  uint r_00;
  uint i;
  int j;
  uint j_00;
  int r;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  res;
  string dummy;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  volt;
  graph g;
  uint local_bc;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_b8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_80;
  graph local_68;
  
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)stream,(string *)&local_a0);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)stream,(string *)&local_a0);
  std::istream::operator>>((istream *)stream,(int *)&local_bc);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)stream,(string *)&local_a0);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)stream,(string *)&local_a0);
  graph::graph(&local_68,local_bc);
  r_00 = local_bc;
  for (i = 0; i != r_00; i = i + 1) {
    for (j_00 = 0; j_00 != r_00; j_00 = j_00 + 1) {
      std::istream::_M_extract<bool>((bool *)stream);
      if ((i <= j_00) &&
         ((char)local_b8.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == '\x01')) {
        graph::addEdge(&local_68,i,j_00);
      }
      r_00 = local_bc;
    }
  }
  readMatrix<std::ifstream>(&local_b8,stream,r_00);
  readMatrix<std::ifstream>(&local_80,stream,local_bc);
  std::
  _Tuple_impl<0ul,graph,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
  ::
  _Tuple_impl<graph&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,void>
            ((_Tuple_impl<0ul,graph,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
              *)__return_storage_ptr__,&local_68,&local_b8,&local_80);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_80);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_b8);
  graph::~graph(&local_68);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

inline auto read_model(auto &stream){
    std::string dummy;
    std::getline(stream, dummy);
    std::getline(stream, dummy);
    int r;
    stream >> r;
    std::getline(stream, dummy);
    std::getline(stream, dummy);
    graph g(r);
    for (int i = 0;i != r;++i)
        for (int j = 0;j != r;++j){
            bool value;
            stream >> value;
            if(i <= j && value)
                g.addEdge(i,j);
        }
    auto res = readMatrix(stream, r);
    auto volt = readMatrix(stream, r);
    return std::make_tuple(g, res, volt);
}